

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpSolver.cc
# Opt level: O0

void __thiscall Minisat::SimpSolver::SimpSolver(SimpSolver *this)

{
  CRef CVar1;
  int32_t *piVar2;
  double *pdVar3;
  bool *pbVar4;
  undefined1 local_50 [8];
  vec<Minisat::Lit,_int> dummy;
  ElimLt local_38 [2];
  ClauseDeleted local_28 [3];
  SimpSolver *local_10;
  SimpSolver *this_local;
  
  local_10 = this;
  Solver::Solver(&this->super_Solver);
  (this->super_Solver)._vptr_Solver = (_func_int **)&PTR__SimpSolver_0012cd80;
  piVar2 = IntOption::operator_cast_to_int_(&opt_grow);
  *(int32_t *)&(this->super_Solver).field_0x35c = *piVar2;
  piVar2 = IntOption::operator_cast_to_int_(&opt_clause_lim);
  this->clause_lim = *piVar2;
  piVar2 = IntOption::operator_cast_to_int_(&opt_subsumption_lim);
  this->subsumption_lim = *piVar2;
  pdVar3 = DoubleOption::operator_cast_to_double_(&opt_simp_garbage_frac);
  this->simp_garbage_frac = *pdVar3;
  pbVar4 = BoolOption::operator_cast_to_bool_(&opt_use_asymm);
  this->use_asymm = (bool)(*pbVar4 & 1);
  pbVar4 = BoolOption::operator_cast_to_bool_(&opt_use_rcheck);
  this->use_rcheck = (bool)(*pbVar4 & 1);
  pbVar4 = BoolOption::operator_cast_to_bool_(&opt_use_elim);
  this->use_elim = (bool)(*pbVar4 & 1);
  this->extend_model = true;
  this->merges = 0;
  this->asymm_lits = 0;
  this->eliminated_vars = 0;
  this->elimorder = 1;
  this->use_simplification = true;
  vec<unsigned_int,_int>::vec(&this->elimclauses);
  VMap<char>::VMap(&this->touched);
  ClauseDeleted::ClauseDeleted(local_28,&(this->super_Solver).ca);
  OccLists<int,_Minisat::vec<unsigned_int,_int>,_Minisat::SimpSolver::ClauseDeleted,_Minisat::MkIndexDefault<int>_>
  ::OccLists(&this->occurs,local_28);
  LMap<int>::LMap(&this->n_occ);
  ElimLt::ElimLt(local_38,&this->n_occ);
  Heap<int,_Minisat::SimpSolver::ElimLt,_Minisat::MkIndexDefault<int>_>::Heap
            (&this->elim_heap,local_38);
  Queue<unsigned_int>::Queue(&this->subsumption_queue);
  VMap<char>::VMap(&this->frozen);
  vec<int,_int>::vec(&this->frozen_vars);
  VMap<char>::VMap(&this->eliminated);
  this->bwdsub_assigns = 0;
  this->n_touched = 0;
  vec<Minisat::Lit,_int>::vec((vec<Minisat::Lit,_int> *)local_50,1,(Lit *)&lit_Undef);
  (this->super_Solver).ca.extra_clause_field = true;
  CVar1 = ClauseAllocator::alloc(&(this->super_Solver).ca,(vec<Minisat::Lit,_int> *)local_50,false);
  this->bwdsub_tmpunit = CVar1;
  (this->super_Solver).remove_satisfied = false;
  vec<Minisat::Lit,_int>::~vec((vec<Minisat::Lit,_int> *)local_50);
  return;
}

Assistant:

SimpSolver::SimpSolver() :
    grow               (opt_grow)
  , clause_lim         (opt_clause_lim)
  , subsumption_lim    (opt_subsumption_lim)
  , simp_garbage_frac  (opt_simp_garbage_frac)
  , use_asymm          (opt_use_asymm)
  , use_rcheck         (opt_use_rcheck)
  , use_elim           (opt_use_elim)
  , extend_model       (true)
  , merges             (0)
  , asymm_lits         (0)
  , eliminated_vars    (0)
  , elimorder          (1)
  , use_simplification (true)
  , occurs             (ClauseDeleted(ca))
  , elim_heap          (ElimLt(n_occ))
  , bwdsub_assigns     (0)
  , n_touched          (0)
{
    vec<Lit> dummy(1,lit_Undef);
    ca.extra_clause_field = true; // NOTE: must happen before allocating the dummy clause below.
    bwdsub_tmpunit        = ca.alloc(dummy);
    remove_satisfied      = false;
}